

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O1

void __thiscall
helics::MessageTimeOperator::MessageTimeOperator
          (MessageTimeOperator *this,
          function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
          *userTimeFunction)

{
  undefined8 uVar1;
  
  (this->super_FilterOperator)._vptr_FilterOperator =
       (_func_int **)&PTR__MessageTimeOperator_00551ed8;
  *(undefined8 *)&(this->TimeFunction).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->TimeFunction).super__Function_base._M_functor + 8) = 0;
  (this->TimeFunction).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->TimeFunction)._M_invoker = userTimeFunction->_M_invoker;
  if ((userTimeFunction->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(userTimeFunction->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->TimeFunction).super__Function_base._M_functor =
         *(undefined8 *)&(userTimeFunction->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->TimeFunction).super__Function_base._M_functor + 8) = uVar1;
    (this->TimeFunction).super__Function_base._M_manager =
         (userTimeFunction->super__Function_base)._M_manager;
    (userTimeFunction->super__Function_base)._M_manager = (_Manager_type)0x0;
    userTimeFunction->_M_invoker = (_Invoker_type)0x0;
  }
  return;
}

Assistant:

MessageTimeOperator::MessageTimeOperator(std::function<Time(Time)> userTimeFunction):
    TimeFunction(std::move(userTimeFunction))
{
}